

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grad-check.cc
# Opt level: O2

bool cnn::CheckGrad(Model *m,ComputationGraph *g,int verbosity)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  long *plVar8;
  ostream *poVar9;
  Tensor *pTVar10;
  long *plVar11;
  bool bVar12;
  undefined8 *puVar13;
  char *pcVar14;
  int iVar15;
  size_t i_1;
  size_t i;
  ulong uVar16;
  Tensor *pTVar17;
  long *plVar18;
  byte bVar19;
  float fVar20;
  real rVar21;
  real rVar22;
  undefined1 extraout_var [60];
  undefined1 auVar23 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar24 [64];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  puVar2 = *(undefined8 **)(m + 0x20);
  for (puVar13 = *(undefined8 **)(m + 0x18); puVar13 != puVar2; puVar13 = puVar13 + 1) {
    Parameters::clear((Parameters *)*puVar13);
  }
  puVar2 = *(undefined8 **)(m + 0x38);
  for (puVar13 = *(undefined8 **)(m + 0x30); puVar13 != puVar2; puVar13 = puVar13 + 1) {
    LookupParameters::clear((LookupParameters *)*puVar13);
  }
  ComputationGraph::forward(g);
  ComputationGraph::backward(g);
  plVar18 = *(long **)(m + 0x20);
  bVar19 = 0;
  bVar12 = false;
  for (plVar8 = *(long **)(m + 0x18); plVar8 != plVar18; plVar8 = plVar8 + 1) {
    lVar3 = *plVar8;
    if (1 < verbosity) {
      poVar9 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      poVar9 = std::operator<<(poVar9,"PARAMETERS ");
      poVar9 = std::ostream::_M_insert<void_const*>(poVar9);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    uVar7 = Dim::size((Dim *)(lVar3 + 8));
    pTVar17 = (Tensor *)(lVar3 + 0x30);
    for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
      iVar15 = (int)uVar16;
      fVar20 = TensorTools::AccessElement(pTVar17,iVar15);
      TensorTools::SetElement(pTVar17,iVar15,fVar20 + -0.0005);
      pTVar10 = ComputationGraph::forward(g);
      rVar21 = as_scalar(pTVar10);
      TensorTools::SetElement(pTVar17,iVar15,fVar20 + 0.0005);
      pTVar10 = ComputationGraph::forward(g);
      rVar22 = as_scalar(pTVar10);
      TensorTools::SetElement(pTVar17,iVar15,fVar20);
      fVar20 = (rVar22 - rVar21) * 999.99994;
      auVar23._0_4_ = TensorTools::AccessElement((Tensor *)(lVar3 + 0x78),iVar15);
      auVar23._4_60_ = extraout_var;
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar5 = vandps_avx(ZEXT416((uint)fVar20),auVar27);
      auVar6 = vandps_avx(ZEXT416((uint)(fVar20 - auVar23._0_4_)),auVar27);
      fVar26 = auVar6._0_4_;
      auVar6 = vandps_avx(auVar23._0_16_,auVar27);
      auVar5 = vmaxss_avx(auVar6,auVar5);
      fVar25 = auVar5._0_4_;
      fVar26 = fVar26 / (float)((uint)(0.1 < fVar26) *
                                ((uint)(0.0 < fVar25) * (int)fVar25 +
                                (uint)(0.0 >= fVar25) * 0x3f800000) +
                               (uint)(0.1 >= fVar26) * 0x3f800000);
      if (0.1 < fVar26 && 0 < verbosity) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"***[");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,fVar26);
        std::operator<<(poVar9,"] ");
        auVar23 = ZEXT1664(auVar23._0_16_);
        bVar19 = 1;
        bVar12 = true;
      }
      else {
        bVar12 = (bool)(bVar12 | 0.1 < fVar26);
      }
      if (1 < (int)((uint)bVar19 + verbosity)) {
        poVar9 = (ostream *)std::ostream::operator<<(&std::cerr,auVar23._0_4_);
        poVar9 = std::operator<<(poVar9,' ');
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,fVar20);
        std::endl<char,std::char_traits<char>>(poVar9);
        bVar19 = 0;
      }
    }
  }
  plVar8 = *(long **)(m + 0x38);
  for (plVar18 = *(long **)(m + 0x30); plVar18 != plVar8; plVar18 = plVar18 + 1) {
    lVar3 = *plVar18;
    if (1 < verbosity) {
      poVar9 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      poVar9 = std::operator<<(poVar9,"LOOKUP PARAMETERS ");
      poVar9 = std::ostream::_M_insert<void_const*>(poVar9);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    uVar7 = Dim::size((Dim *)(lVar3 + 8));
    plVar11 = (long *)(lVar3 + 0x70);
    while (plVar11 = (long *)*plVar11, plVar11 != (long *)0x0) {
      uVar1 = *(uint *)(plVar11 + 1);
      if (1 < verbosity) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"OBJECT=");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      pTVar17 = (Tensor *)(*(long *)(lVar3 + 0x30) + (ulong)uVar1 * 0x48);
      lVar4 = *(long *)(lVar3 + 0x48);
      for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
        iVar15 = (int)uVar16;
        fVar20 = TensorTools::AccessElement(pTVar17,iVar15);
        TensorTools::SetElement(pTVar17,iVar15,fVar20 + -0.0005);
        pTVar10 = ComputationGraph::forward(g);
        rVar21 = as_scalar(pTVar10);
        TensorTools::SetElement(pTVar17,iVar15,fVar20 + 0.0005);
        pTVar10 = ComputationGraph::forward(g);
        rVar22 = as_scalar(pTVar10);
        TensorTools::SetElement(pTVar17,iVar15,fVar20);
        fVar20 = (rVar22 - rVar21) * 999.99994;
        auVar24._0_4_ = TensorTools::AccessElement((Tensor *)((ulong)uVar1 * 0x48 + lVar4),iVar15);
        auVar24._4_60_ = extraout_var_00;
        auVar28._8_4_ = 0x7fffffff;
        auVar28._0_8_ = 0x7fffffff7fffffff;
        auVar28._12_4_ = 0x7fffffff;
        auVar5 = vandps_avx(ZEXT416((uint)fVar20),auVar28);
        auVar6 = vandps_avx(ZEXT416((uint)(fVar20 - auVar24._0_4_)),auVar28);
        fVar26 = auVar6._0_4_;
        auVar6 = vandps_avx(auVar24._0_16_,auVar28);
        auVar5 = vmaxss_avx(auVar6,auVar5);
        fVar25 = auVar5._0_4_;
        fVar26 = fVar26 / (float)((uint)(0.1 < fVar26) *
                                  ((uint)(0.0 < fVar25) * (int)fVar25 +
                                  (uint)(0.0 >= fVar25) * 0x3f800000) +
                                 (uint)(0.1 >= fVar26) * 0x3f800000);
        if (0.1 < fVar26 && 0 < verbosity) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"***[");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,fVar26);
          std::operator<<(poVar9,"] ");
          auVar24 = ZEXT1664(auVar24._0_16_);
          bVar19 = 1;
          bVar12 = true;
        }
        else {
          bVar12 = (bool)(bVar12 | 0.1 < fVar26);
        }
        if (1 < (int)((uint)bVar19 + verbosity)) {
          poVar9 = (ostream *)std::ostream::operator<<(&std::cerr,auVar24._0_4_);
          poVar9 = std::operator<<(poVar9,' ');
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,fVar20);
          std::endl<char,std::char_traits<char>>(poVar9);
          bVar19 = 0;
        }
      }
    }
  }
  if (bVar12) {
    if (verbosity < 2) goto LAB_00241bf4;
    pcVar14 = "*** GRADIENT CHECK FAILED ***";
  }
  else {
    if (verbosity < 1) goto LAB_00241bf4;
    pcVar14 = "GRADIENT CHECK PASSED";
  }
  poVar9 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  poVar9 = std::operator<<(poVar9,pcVar14);
  std::endl<char,std::char_traits<char>>(poVar9);
LAB_00241bf4:
  return (bool)~bVar12;
}

Assistant:

bool CheckGrad(Model& m, ComputationGraph& g, int verbosity) {
  // Clear the parameters first
  const vector<Parameters*>& params = m.parameters_list();
  const vector<LookupParameters*>& lookup_params = m.lookup_parameters_list();
  for (auto pp : params)
    pp->clear();
  for (auto pp : lookup_params)
    pp->clear();

  // Perform forward and backward steps
  float alpha = 5e-4;
  g.forward();
  g.backward();

  // Check
  bool flag = false, curr_flag = false;
  for (auto pp : params) {
    if(verbosity > 1)
      cerr << endl << "PARAMETERS " << pp << endl;
    Parameters& p = *pp;
    size_t ts = p.dim.size();
    for (size_t i = 0; i < ts; ++i) {
      float old = TensorTools::AccessElement(p.values, i);
      TensorTools::SetElement(p.values, i, old - alpha);
      float E_left = as_scalar(g.forward());
      TensorTools::SetElement(p.values, i, old + alpha);
      float E_right = as_scalar(g.forward());
      TensorTools::SetElement(p.values, i, old);
      float g = (E_right - E_left) / (2 * alpha);
      float g_act = TensorTools::AccessElement(p.g, i);
      float f = fabs(g - g_act);
      float m = max(fabs(g), fabs(g_act));
      if (f > 0.1 && m > 0.f) f /= m;
      if (f > 0.1 || std::isnan(f)) { flag = true; if(verbosity > 0) { curr_flag = true; cerr << "***[" << f << "] "; } }
      if(verbosity + (curr_flag ? 1 : 0) > 1) {
        cerr << g_act << ' ' << g << endl;
        curr_flag = false;
      }
    }
  }

  for (auto pp : lookup_params) {
    if(verbosity > 1)
      cerr << endl << "LOOKUP PARAMETERS " << pp << endl;
    LookupParameters& p = *pp;
    size_t ts = p.dim.size();
    for (unsigned j : p.non_zero_grads) {
      if(verbosity > 1)
        cerr << "OBJECT=" << j << endl;
      Tensor& v = p.values[j];
      Tensor& ag = p.grads[j];
      for (size_t i = 0; i < ts; ++i) {
        float old = TensorTools::AccessElement(v, i);
        TensorTools::SetElement(v, i, old - alpha);
        float E_left = as_scalar(g.forward());
        TensorTools::SetElement(v, i, old + alpha);
        float E_right = as_scalar(g.forward());
        TensorTools::SetElement(v, i, old);
        float g = (E_right - E_left) / (2 * alpha);
        float g_act = TensorTools::AccessElement(ag, i);
        float f = fabs(g - g_act);
        float m = max(fabs(g), fabs(g_act));
        if (f > 0.1 && m > 0.f) f /= m;
        if (f > 0.1 || std::isnan(f)) { flag = true; if(verbosity > 0) { curr_flag = true; cerr << "***[" << f << "] "; } }
        if(verbosity + (curr_flag ? 1 : 0) > 1) {
          cerr << g_act << ' ' << g << endl;
          curr_flag = false;
        }
      }
    }
  }

  if (flag) {
    if (verbosity > 1)
      cerr << endl << "*** GRADIENT CHECK FAILED ***" << endl;
  } else {
    if (verbosity > 0)
      cerr << endl << "GRADIENT CHECK PASSED" << endl;
  }
  return !flag;
}